

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::Inserter::
insertOne(Inserter *this,qsizetype pos,pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *t)

{
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar1;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar2;
  long lVar3;
  long lVar4;
  
  ppVar1 = this->begin;
  lVar4 = this->size;
  ppVar2 = ppVar1 + lVar4;
  this->end = ppVar2;
  this->last = ppVar1 + lVar4 + -1;
  this->where = ppVar1 + pos;
  lVar3 = lVar4 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar3;
  this->sourceCopyAssign = 1;
  if (lVar3 < 1) {
    this->sourceCopyConstruct = 1 - lVar3;
    this->move = 0;
    this->sourceCopyAssign = lVar3;
  }
  if (this->sourceCopyConstruct == 0) {
    QHttpNetworkRequest::QHttpNetworkRequest(&ppVar2->first,&ppVar1[lVar4 + -1].first);
    ppVar2->second = ppVar2[-1].second;
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar4 = 0;
      lVar3 = 0;
      do {
        ppVar2 = this->last;
        QHttpNetworkRequest::operator=
                  ((QHttpNetworkRequest *)
                   ((long)&(ppVar2->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader + lVar4
                   ),(QHttpNetworkRequest *)
                     ((long)&ppVar2[-1].first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader +
                     lVar4));
        *(undefined8 *)((long)&ppVar2->second + lVar4) = *(undefined8 *)((long)ppVar2 + lVar4 + -8);
        lVar3 = lVar3 + -1;
        lVar4 = lVar4 + -0x18;
      } while (lVar3 != this->move);
    }
    ppVar2 = this->where;
    QHttpNetworkRequest::operator=(&ppVar2->first,&t->first);
    ppVar2->second = t->second;
  }
  else {
    QHttpNetworkRequest::QHttpNetworkRequest(&ppVar2->first,&t->first);
    ppVar2->second = t->second;
    this->size = this->size + 1;
  }
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }